

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QSequentialAnimationGroupPrivate *this)

{
  int iVar1;
  parameter_type pVar2;
  QSequentialAnimationGroup *pQVar3;
  qsizetype qVar4;
  reference piVar5;
  QList<QAbstractAnimation_*> *this_00;
  QAbstractAnimation **ppQVar6;
  QSequentialAnimationGroupPrivate *in_RDI;
  int in_stack_0000000c;
  QSequentialAnimationGroup *q;
  QAbstractAnimation *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 intermediate;
  QSequentialAnimationGroupPrivate *this_01;
  
  this_01 = in_RDI;
  pQVar3 = q_func(in_RDI);
  while( true ) {
    qVar4 = QList<int>::size(&in_RDI->actualDuration);
    intermediate = (undefined1)((ulong)pQVar3 >> 0x38);
    if (in_RDI->currentAnimationIndex + 1 <= qVar4) break;
    QList<int>::append((QList<int> *)0x68afde,
                       (parameter_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = QAbstractAnimation::currentTime
                    ((QAbstractAnimation *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  piVar5 = QList<int>::operator[]
                     ((QList<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                      (qsizetype)in_stack_ffffffffffffffd8);
  *piVar5 = iVar1;
  QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
            ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
              *)0x68b031);
  QAnimationGroupPrivate::disconnectUncontrolledAnimation
            ((QAnimationGroupPrivate *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  pVar2 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x68b04c);
  if (pVar2 == Forward) {
    this_00 = (QList<QAbstractAnimation_*> *)
              QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                        ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                          *)0x68b062);
    ppQVar6 = QList<QAbstractAnimation_*>::last(this_00);
    if (this_00 == (QList<QAbstractAnimation_*> *)*ppQVar6) goto LAB_0068b0a4;
  }
  pVar2 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x68b091);
  if ((pVar2 != Backward) || (in_RDI->currentAnimationIndex != 0)) {
    pVar2 = ::QObjectCompatProperty::operator_cast_to_Direction
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                        *)0x68b0be);
    if (pVar2 == Forward) {
      setCurrentAnimation(this_01,in_stack_0000000c,(bool)intermediate);
      return;
    }
    setCurrentAnimation(this_01,in_stack_0000000c,(bool)intermediate);
    return;
  }
LAB_0068b0a4:
  QAbstractAnimation::stop((QAbstractAnimation *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QSequentialAnimationGroup);
    Q_ASSERT(qobject_cast<QAbstractAnimation *>(q->sender()) == currentAnimation);

    // we trust the duration returned by the animation
    while (actualDuration.size() < (currentAnimationIndex + 1))
        actualDuration.append(-1);
    actualDuration[currentAnimationIndex] = currentAnimation->currentTime();

    disconnectUncontrolledAnimation(currentAnimation);

    if ((direction == QAbstractAnimation::Forward && currentAnimation == animations.last())
        || (direction == QAbstractAnimation::Backward && currentAnimationIndex == 0)) {
        // we don't handle looping of a group with undefined duration
        q->stop();
    } else if (direction == QAbstractAnimation::Forward) {
        // set the current animation to be the next one
        setCurrentAnimation(currentAnimationIndex + 1);
    } else {
        // set the current animation to be the previous one
        setCurrentAnimation(currentAnimationIndex - 1);
    }
}